

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

uint * __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::consume_operation::element<unsigned_int>(consume_operation *this)

{
  LfQueueControl *i_control;
  bool bVar1;
  runtime_type<> *this_00;
  uint *puVar2;
  consume_operation *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    this_00 = complete_type(this);
    bVar1 = runtime_type<>::is<unsigned_int>(this_00);
    if (bVar1) goto LAB_026b6720;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
             ,0x410);
LAB_026b6720:
  i_control = (this->m_consume_data).m_control;
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::external(&this->m_consume_data);
  puVar2 = (uint *)detail::
                   LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                   ::get_element(i_control,bVar1);
  return puVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(
                  Base::get_element(m_consume_data.m_control, m_consume_data.external()));
            }